

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O2

void __thiscall soplex::SoPlexBase<double>::_storeBasis(SoPlexBase<double> *this)

{
  if (this->_hasBasis == true) {
    this->_storedBasis = true;
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
              (&this->_storedBasisStatusCols,&this->_basisStatusCols);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
              (&this->_storedBasisStatusRows,&this->_basisStatusRows);
    return;
  }
  this->_storedBasis = false;
  return;
}

Assistant:

void SoPlexBase<R>::_storeBasis()
{
   assert(!_storedBasis);

   if(_hasBasis)
   {
      _storedBasis = true;
      _storedBasisStatusCols = _basisStatusCols;
      _storedBasisStatusRows = _basisStatusRows;
   }
   else
      _storedBasis = false;
}